

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-validator.cpp
# Opt level: O2

bool __thiscall
wasm::ValidationInfo::shouldBeEqualOrFirstIsUnreachable<wasm::MemoryFill*,wasm::Type>
          (ValidationInfo *this,Type left,Type right,MemoryFill *curr,char *text,Function *func)

{
  ostream *poVar1;
  ostringstream local_1e0 [8];
  ostringstream ss;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  Function *local_48;
  MemoryFill *local_40;
  ValidationInfo *local_38;
  
  if (left.id != right.id && left.id != 1) {
    local_48 = func;
    local_40 = curr;
    local_38 = this;
    std::__cxx11::ostringstream::ostringstream(local_1e0);
    poVar1 = wasm::operator<<((ostream *)local_1e0,left);
    poVar1 = std::operator<<(poVar1," != ");
    poVar1 = wasm::operator<<(poVar1,right);
    poVar1 = std::operator<<(poVar1,": ");
    std::operator<<(poVar1,text);
    std::__cxx11::stringbuf::str();
    fail<wasm::MemoryFill*,std::__cxx11::string>(local_38,&local_68,local_40,local_48);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::ostringstream::~ostringstream(local_1e0);
  }
  return left.id == right.id || left.id == 1;
}

Assistant:

bool shouldBeEqualOrFirstIsUnreachable(
    S left, S right, T curr, const char* text, Function* func = nullptr) {
    if (left != Type::unreachable && left != right) {
      std::ostringstream ss;
      ss << left << " != " << right << ": " << text;
      fail(ss.str(), curr, func);
      return false;
    }
    return true;
  }